

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall String::operator=(String *this,String *other)

{
  Data *pDVar1;
  char *pcVar2;
  usize uVar3;
  uint64 uVar4;
  ulong uVar5;
  Data *pDVar6;
  usize capacity;
  Data *otherData;
  String *other_local;
  String *this_local;
  
  pDVar1 = other->data;
  if (pDVar1->ref == 0) {
    if (((this->data->ref != 0) && (uVar4 = Atomic::decrement(&this->data->ref), uVar4 == 0)) &&
       (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
    }
    uVar5 = pDVar1->len | 3;
    pDVar6 = (Data *)operator_new__(uVar5 + 0x21);
    this->data = pDVar6;
    this->data->str = (char *)(this->data + 1);
    Memory::copy((Memory *)this->data->str,(EVP_PKEY_CTX *)pDVar1->str,(EVP_PKEY_CTX *)pDVar1->len);
    pcVar2 = this->data->str;
    uVar3 = pDVar1->len;
    this->data->len = uVar3;
    pcVar2[uVar3] = '\0';
    this->data->ref = 1;
    this->data->capacity = uVar5;
  }
  else {
    Atomic::increment(&pDVar1->ref);
    if (((this->data->ref != 0) && (uVar4 = Atomic::decrement(&this->data->ref), uVar4 == 0)) &&
       (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
    }
    this->data = pDVar1;
  }
  return this;
}

Assistant:

String& operator=(const String& other)
  {
    Data* otherData = other.data;
    if(otherData->ref)
    {
      Atomic::increment(otherData->ref);
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;
      data = otherData;
    }
    else
    {
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;
      usize capacity = otherData->len | 0x3;
      data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
      data->str = (char*)((byte*)data + sizeof(Data));
      Memory::copy((char*)data->str, otherData->str, otherData->len * sizeof(char));
      ((char*)data->str)[data->len = otherData->len] = '\0';
      data->ref = 1;
      data->capacity = capacity;
    }
    return *this;
  }